

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimvcd.cpp
# Opt level: O1

void __thiscall
BtorSimVCDWriter::add_value_change(BtorSimVCDWriter *this,int64_t k,int64_t id,BtorSimState state)

{
  _Rb_tree_header *p_Var1;
  string *psVar2;
  pointer pBVar3;
  int32_t iVar4;
  int iVar5;
  undefined8 *puVar6;
  iterator iVar7;
  long *plVar8;
  undefined4 extraout_var;
  BtorSimBitVector *pBVar9;
  undefined8 uVar10;
  string *psVar11;
  _Base_ptr p_Var12;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *extraout_RDX_03;
  EVP_PKEY_CTX *extraout_RDX_04;
  EVP_PKEY_CTX *extraout_RDX_05;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX_06;
  _Hash_node_base *p_Var13;
  _Base_ptr p_Var14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  anon_union_8_2_8be7de1a_for_BtorSimState_2 a;
  undefined1 *puVar16;
  string sval_1;
  string sval;
  undefined1 local_e8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  BtorSimBitVector *local_88;
  anon_union_8_2_8be7de1a_for_BtorSimState_2 local_80;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_78;
  string local_70;
  string local_50;
  
  a = state.field_1;
  p_Var1 = &(this->clocks)._M_t._M_impl.super__Rb_tree_header;
  p_Var14 = (this->clocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var12 = &p_Var1->_M_header;
  for (; p_Var14 != (_Base_ptr)0x0; p_Var14 = (&p_Var14->_M_left)[*(long *)(p_Var14 + 1) < id]) {
    if (id <= *(long *)(p_Var14 + 1)) {
      p_Var12 = p_Var14;
    }
  }
  p_Var14 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var12 != p_Var1) && (p_Var14 = p_Var12, id < *(long *)(p_Var12 + 1))) {
    p_Var14 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var14 == p_Var1) {
    if (state.type == ARRAY) {
      if (a.bv_state == (BtorSimBitVector *)0x0) goto LAB_0010d177;
      puVar16 = (undefined1 *)(id * 0x10);
      if (*(BtorSimBitVector **)
           (puVar16 +
           (long)&((this->prev_value).
                   super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>._M_impl.
                   super__Vector_impl_data._M_start)->field_1) == (BtorSimBitVector *)0x0 ||
          *(BtorSimBitVector **)
           (puVar16 +
           (long)&((this->prev_value).
                   super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>._M_impl.
                   super__Vector_impl_data._M_start)->field_1) != a.bv_state) {
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)k;
        update_time(this,k);
        p_Var13 = ((a.array_state)->data)._M_h._M_before_begin._M_nxt;
        src = extraout_RDX;
        local_80 = a;
        if (p_Var13 != (_Hash_node_base *)0x0) {
          local_78 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->value_changes;
          do {
            local_a8._M_allocated_capacity = (size_type)&local_98;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_a8,p_Var13[1]._M_nxt,
                       (long)&(p_Var13[1]._M_nxt)->_M_nxt + (long)&(p_Var13[2]._M_nxt)->_M_nxt);
            local_88 = (BtorSimBitVector *)p_Var13[5]._M_nxt;
            if ((*(long *)(puVar16 +
                          (long)&((this->prev_value).
                                  super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->field_1) == 0) ||
               (iVar7 = std::
                        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                *)(*(long *)(puVar16 +
                                            (long)&((this->prev_value).
                                                                                                        
                                                  super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  field_1) + 0x20),(key_type *)&local_a8),
               iVar7.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>,_true>
               ._M_cur == (__node_type *)0x0)) {
LAB_0010cf9b:
              local_e8._0_8_ = local_e8 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"");
              if (1 < local_88->width) {
                std::__cxx11::string::append(local_e8);
              }
              btorsim_bv_to_string_abi_cxx11_((string *)&local_c8,local_88);
              std::__cxx11::string::_M_append(local_e8,local_c8._M_allocated_capacity);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_allocated_capacity != &local_b8) {
                operator_delete((void *)local_c8._M_allocated_capacity);
              }
              if (1 < local_88->width) {
                std::__cxx11::string::append(local_e8);
              }
              local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
              k = (int64_t)&local_70;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)k,local_a8._M_allocated_capacity,
                         (char *)(local_a8._M_allocated_capacity + local_a8._8_8_));
              get_am_identifier(&local_50,this,id,(string *)k);
              plVar8 = (long *)std::__cxx11::string::replace
                                         ((ulong)&local_50,0,(char *)0x0,local_e8._0_8_);
              local_c8._M_allocated_capacity = (size_type)&local_b8;
              paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(plVar8 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar8 == paVar15) {
                local_b8._M_allocated_capacity = paVar15->_M_allocated_capacity;
                local_b8._8_8_ = plVar8[3];
              }
              else {
                local_b8._M_allocated_capacity = paVar15->_M_allocated_capacity;
                local_c8._M_allocated_capacity =
                     (size_type)
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*plVar8;
              }
              local_c8._8_8_ = plVar8[1];
              *plVar8 = (long)paVar15;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              paVar15 = &local_c8;
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        (local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)paVar15);
              src = extraout_RDX_01;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_allocated_capacity != &local_b8) {
                operator_delete((void *)local_c8._M_allocated_capacity);
                src = extraout_RDX_02;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p);
                src = extraout_RDX_03;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_dataplus._M_p != &local_70.field_2) {
                operator_delete(local_70._M_dataplus._M_p);
                src = extraout_RDX_04;
              }
              if ((string *)local_e8._0_8_ != (string *)(local_e8 + 0x10)) {
                operator_delete((void *)local_e8._0_8_);
                src = extraout_RDX_05;
              }
            }
            else {
              paVar15 = &local_a8;
              iVar7 = std::
                      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                              *)(*(long *)(puVar16 +
                                          (long)&((this->prev_value).
                                                  super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                 field_1) + 0x20),(key_type *)paVar15);
              if (iVar7.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>,_true>
                  ._M_cur == (__node_type *)0x0) {
                uVar10 = std::__throw_out_of_range("_Map_base::at");
                if (local_e8._0_8_ != k) {
                  operator_delete((void *)local_e8._0_8_);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c8._M_allocated_capacity != &local_b8) {
                  operator_delete((void *)local_c8._M_allocated_capacity);
                }
                if ((undefined1 *)local_a8._M_allocated_capacity != puVar16) {
                  operator_delete((void *)local_a8._M_allocated_capacity);
                }
                _Unwind_Resume(uVar10);
              }
              src = extraout_RDX_00;
              if (*(BtorSimBitVector **)
                   ((long)iVar7.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>,_true>
                          ._M_cur + 0x28) != local_88) goto LAB_0010cf9b;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_allocated_capacity != &local_98) {
              operator_delete((void *)local_a8._M_allocated_capacity);
              src = extraout_RDX_06;
            }
            p_Var13 = p_Var13->_M_nxt;
          } while (p_Var13 != (_Hash_node_base *)0x0);
        }
        pBVar3 = (this->prev_value).super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        iVar5 = BtorSimArrayModel::copy
                          (local_80.array_state,(EVP_PKEY_CTX *)paVar15->_M_local_buf,src);
        BtorSimState::update
                  ((BtorSimState *)(puVar16 + (long)pBVar3),
                   (BtorSimArrayModel *)CONCAT44(extraout_var,iVar5));
      }
    }
    else {
      if (state.type != BITVEC) {
        die("Invalid state");
        return;
      }
      if (a.bv_state == (BtorSimBitVector *)0x0) {
LAB_0010d177:
        msg(1,"No current state for named state %ld!",id);
        return;
      }
      pBVar9 = (this->prev_value).super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>.
               _M_impl.super__Vector_impl_data._M_start[id].field_1.bv_state;
      if ((pBVar9 == (BtorSimBitVector *)0x0) ||
         (iVar4 = btorsim_bv_compare(a.bv_state,pBVar9), iVar4 != 0)) {
        update_time(this,k);
        local_a8._M_allocated_capacity = (size_type)&local_98;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"");
        if (1 < (a.bv_state)->width) {
          std::__cxx11::string::append(local_a8._M_local_buf);
        }
        btorsim_bv_to_string_abi_cxx11_((string *)local_e8,a.bv_state);
        std::__cxx11::string::_M_append(local_a8._M_local_buf,local_e8._0_8_);
        psVar2 = (string *)(local_e8 + 0x10);
        if ((string *)local_e8._0_8_ != psVar2) {
          operator_delete((void *)local_e8._0_8_);
        }
        if (1 < (a.bv_state)->width) {
          std::__cxx11::string::append(local_a8._M_local_buf);
        }
        get_bv_identifier_abi_cxx11_((string *)&local_c8,this,id);
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_c8,0,(char *)0x0,local_a8._M_allocated_capacity);
        psVar11 = (string *)(puVar6 + 2);
        if ((string *)*puVar6 == psVar11) {
          local_e8._16_8_ = (psVar11->_M_dataplus)._M_p;
          local_e8._24_8_ = puVar6[3];
          local_e8._0_8_ = psVar2;
        }
        else {
          local_e8._16_8_ = (psVar11->_M_dataplus)._M_p;
          local_e8._0_8_ = (string *)*puVar6;
        }
        local_e8._8_8_ = puVar6[1];
        *puVar6 = psVar11;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &this->value_changes,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8);
        if ((string *)local_e8._0_8_ != psVar2) {
          operator_delete((void *)local_e8._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_allocated_capacity != &local_b8) {
          operator_delete((void *)local_c8._M_allocated_capacity);
        }
        pBVar3 = (this->prev_value).super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pBVar9 = btorsim_bv_copy(a.bv_state);
        BtorSimState::update(pBVar3 + id,pBVar9);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_allocated_capacity != &local_98) {
          operator_delete((void *)local_a8._M_allocated_capacity);
        }
      }
    }
  }
  return;
}

Assistant:

void
BtorSimVCDWriter::add_value_change (int64_t k, int64_t id, BtorSimState state)
{
  if (clocks.find (id) != clocks.end ()) return;
  switch (state.type)
  {
    case BtorSimState::Type::BITVEC: {
      if (!state.bv_state)
      {
        msg (1, "No current state for named state %" PRId64 "!", id);
        return;
      }
      if (!prev_value[id].bv_state
          || btorsim_bv_compare (state.bv_state, prev_value[id].bv_state))
      {
        update_time (k);
        std::string sval ("");
        if (state.bv_state->width > 1) sval += "b";
        sval += btorsim_bv_to_string (state.bv_state);
        if (state.bv_state->width > 1) sval += " ";
        value_changes.push_back (sval + get_bv_identifier (id));
        prev_value[id].update (btorsim_bv_copy (state.bv_state));
      }
    }
    break;
    case BtorSimState::Type::ARRAY: {
      if (!state.array_state)
      {
        msg (1, "No current state for named state %" PRId64 "!", id);
        return;
      }

      if (!prev_value[id].array_state
          || state.array_state != prev_value[id].array_state)
      {
        update_time (k);
        for (auto it : state.array_state->data)
        {
          if (!prev_value[id].array_state
              || prev_value[id].array_state->data.find (it.first)
                     == prev_value[id].array_state->data.end ()
              || prev_value[id].array_state->data.at (it.first) != it.second)
          {
            std::string sval ("");
            if (it.second->width > 1) sval += "b";
            sval += btorsim_bv_to_string (it.second);
            if (it.second->width > 1) sval += " ";
            value_changes.push_back (sval + get_am_identifier (id, it.first));
          }
        }
        prev_value[id].update (state.array_state->copy ());
      }
    }
    break;
    default: die ("Invalid state");
  }
}